

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregator.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_7d218::PercentTotalKernel::aggregate
          (PercentTotalKernel *this,CaliperMetadataAccessInterface *db,EntryList *list)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  cali_variant_t local_88;
  double local_78;
  double val;
  cali_id_t id;
  Entry *e;
  const_iterator __end2;
  const_iterator __begin2;
  EntryList *__range2;
  cali_id_t sum_id;
  cali_id_t target_id;
  Attribute sum_attr;
  Attribute percentage_attr;
  Attribute target_attr;
  EntryList *list_local;
  CaliperMetadataAccessInterface *db_local;
  PercentTotalKernel *this_local;
  
  percentage_attr = Config::get_target_attr(this->m_config,db);
  cali::Attribute::Attribute(&sum_attr);
  cali::Attribute::Attribute((Attribute *)&target_id);
  bVar1 = Config::get_percentage_attribute(this->m_config,db,&sum_attr,(Attribute *)&target_id);
  if (bVar1) {
    dVar2 = (double)cali::Attribute::id(&percentage_attr);
    dVar3 = (double)cali::Attribute::id((Attribute *)&target_id);
    __end2 = std::vector<cali::Entry,_std::allocator<cali::Entry>_>::begin(list);
    e = (Entry *)std::vector<cali::Entry,_std::allocator<cali::Entry>_>::end(list);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
                                       *)&e), bVar1) {
      id = (cali_id_t)
           __gnu_cxx::
           __normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
           ::operator*(&__end2);
      val = (double)cali::Entry::attribute((Entry *)id);
      if ((val == dVar2) || (val == dVar3)) {
        local_88 = (cali_variant_t)cali::Entry::value((Entry *)id);
        local_78 = cali::Variant::to_double((Variant *)&local_88,(bool *)0x0);
        this->m_sum = local_78 + this->m_sum;
        this->m_isum = local_78 + this->m_isum;
        Config::add(this->m_config,local_78);
      }
      __gnu_cxx::
      __normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void aggregate(CaliperMetadataAccessInterface& db, const EntryList& list)
    {
        Attribute target_attr = m_config->get_target_attr(db);
        Attribute percentage_attr, sum_attr;

        if (!m_config->get_percentage_attribute(db, percentage_attr, sum_attr))
            return;

        cali_id_t target_id = target_attr.id();
        cali_id_t sum_id    = sum_attr.id();

        for (const Entry& e : list) {
            cali_id_t id = e.attribute();

            if (id == target_id || id == sum_id) {
                double val = e.value().to_double();
                m_sum += val;
                m_isum += val;
                m_config->add(val);
            }
        }
    }